

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConst(BinaryWriterSpec *this,Const *const_)

{
  Const *const__local;
  BinaryWriterSpec *this_local;
  
  Stream::Writef(this->json_stream_,"{");
  WriteKey(this,"type");
  switch(const_->type) {
  case F64:
    WriteString(this,"f64");
    WriteSeparator(this);
    WriteKey(this,"value");
    Stream::Writef(this->json_stream_,"\"%lu\"",(const_->field_2).u64);
    break;
  case F32:
    WriteString(this,"f32");
    WriteSeparator(this);
    WriteKey(this,"value");
    Stream::Writef(this->json_stream_,"\"%u\"",(ulong)(const_->field_2).u32);
    break;
  case I64:
    WriteString(this,"i64");
    WriteSeparator(this);
    WriteKey(this,"value");
    Stream::Writef(this->json_stream_,"\"%lu\"",(const_->field_2).u64);
    break;
  case I32:
    WriteString(this,"i32");
    WriteSeparator(this);
    WriteKey(this,"value");
    Stream::Writef(this->json_stream_,"\"%u\"",(ulong)(const_->field_2).u32);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc"
                  ,0xcc,
                  "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteConst(const Const &)");
  }
  Stream::Writef(this->json_stream_,"}");
  return;
}

Assistant:

void BinaryWriterSpec::WriteConst(const Const& const_) {
  json_stream_->Writef("{");
  WriteKey("type");

  /* Always write the values as strings, even though they may be representable
   * as JSON numbers. This way the formatting is consistent. */
  switch (const_.type) {
    case Type::I32:
      WriteString("i32");
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("\"%u\"", const_.u32);
      break;

    case Type::I64:
      WriteString("i64");
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("\"%" PRIu64 "\"", const_.u64);
      break;

    case Type::F32: {
      /* TODO(binji): write as hex float */
      WriteString("f32");
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("\"%u\"", const_.f32_bits);
      break;
    }

    case Type::F64: {
      /* TODO(binji): write as hex float */
      WriteString("f64");
      WriteSeparator();
      WriteKey("value");
      json_stream_->Writef("\"%" PRIu64 "\"", const_.f64_bits);
      break;
    }

    default:
      assert(0);
  }

  json_stream_->Writef("}");
}